

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  if ((int)from_msg[1]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 1),(RepeatedPtrFieldBase *)(from_msg + 1));
  }
  if (*(int *)&from_msg[3]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[2]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[2]._internal_metadata_);
  }
  if ((int)from_msg[4]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 4),(RepeatedPtrFieldBase *)(from_msg + 4));
  }
  if (*(int *)&from_msg[6]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[5]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[5]._internal_metadata_);
  }
  if ((int)from_msg[7]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 7),(RepeatedPtrFieldBase *)(from_msg + 7));
  }
  if (*(int *)&from_msg[9]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[8]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[8]._internal_metadata_);
  }
  if ((int)from_msg[10]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 10),(RepeatedPtrFieldBase *)(from_msg + 10));
  }
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
            (&to_msg->_internal_metadata_,(string *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite_RepeatedFieldsGenerator&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field1()->MergeFrom(
      from._internal_field1());
  _this->_internal_mutable_field2()->MergeFrom(
      from._internal_field2());
  _this->_internal_mutable_field3()->MergeFrom(
      from._internal_field3());
  _this->_internal_mutable_group1()->MergeFrom(
      from._internal_group1());
  _this->_internal_mutable_group2()->MergeFrom(
      from._internal_group2());
  _this->_internal_mutable_ext1()->MergeFrom(
      from._internal_ext1());
  _this->_internal_mutable_ext2()->MergeFrom(
      from._internal_ext2());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}